

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O2

void __thiscall
RasterizerA3<8u>::_renderImpl<CompositorSIMD,true>(RasterizerA3<8u> *this,uint32_t argb32)

{
  int *piVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint32_t uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint32_t *puVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong *puVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  short sVar36;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  short sVar44;
  undefined1 in_XMM2 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar46 [16];
  short sVar47;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  undefined1 in_XMM6 [16];
  undefined1 auVar48 [16];
  short sVar55;
  undefined1 in_XMM8 [16];
  undefined1 auVar56 [16];
  short sVar58;
  short sVar59;
  short sVar61;
  uint uVar60;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar57 [16];
  short sVar66;
  uint uVar65;
  short sVar67;
  undefined1 auVar68 [12];
  short sVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar83;
  short sVar84;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  int iVar104;
  int iVar110;
  int iVar112;
  undefined1 in_XMM13 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar111;
  uint uVar113;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar73 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  ushort uVar80;
  short sVar81;
  ushort uVar82;
  
  lVar6 = *(long *)(*(long *)(this + 8) + 8);
  uVar29 = (ulong)*(int *)(this + 0x40);
  iVar4 = *(int *)(this + 0x44);
  puVar30 = (ulong *)(*(long *)(this + 0x48) * uVar29 * 8 + *(long *)(this + 0x50));
  lVar32 = *(long *)(this + 0x58) * uVar29 * 8 + *(long *)(this + 0x60);
  lVar33 = lVar6 * uVar29 + *(long *)(*(long *)(this + 8) + 0x10);
  uVar17 = PixelUtils::premultiply(argb32);
  auVar16 = _DAT_00110170;
  auVar15 = _DAT_00110140;
  auVar35._4_4_ = uVar17;
  auVar35._0_4_ = uVar17;
  auVar35._8_4_ = uVar17;
  auVar35._12_4_ = uVar17;
  auVar37 = pmovzxbw(in_XMM1,auVar35);
  auVar45 = pmovzxbw(in_XMM2,0xffffffffffffffff);
  auVar46 = pmovzxbw(in_XMM3,0x8080808080808080);
  auVar48 = pmovzxbw(in_XMM6,0x8080808080808080);
  auVar56 = pmovzxbw(in_XMM8,0xffffffffffffffff);
  for (; uVar29 <= (ulong)(long)iVar4; uVar29 = uVar29 + 1) {
    lVar19 = *(long *)(this + 0x48);
    uVar113 = 0;
    uVar21 = 0;
    uVar20 = 0;
    do {
      uVar25 = *puVar30;
      *puVar30 = 0;
      uVar28 = uVar20 + 0x200;
      while( true ) {
        sVar36 = auVar37._0_2_;
        sVar38 = auVar37._2_2_;
        sVar39 = auVar37._4_2_;
        sVar40 = auVar37._6_2_;
        sVar41 = auVar37._8_2_;
        sVar42 = auVar37._10_2_;
        sVar43 = auVar37._12_2_;
        sVar44 = auVar37._14_2_;
        sVar84 = auVar46._0_2_;
        sVar89 = auVar46._2_2_;
        sVar91 = auVar46._4_2_;
        sVar93 = auVar46._6_2_;
        sVar95 = auVar46._8_2_;
        sVar97 = auVar46._10_2_;
        sVar99 = auVar46._12_2_;
        sVar101 = auVar46._14_2_;
        sVar47 = auVar48._0_2_;
        sVar49 = auVar48._2_2_;
        sVar50 = auVar48._4_2_;
        sVar51 = auVar48._6_2_;
        sVar52 = auVar48._8_2_;
        sVar53 = auVar48._10_2_;
        sVar54 = auVar48._12_2_;
        sVar55 = auVar48._14_2_;
        if (uVar25 == 0) break;
        lVar7 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        uVar31 = -1L << ((byte)lVar7 & 0x3f);
        uVar22 = (uint)((int)lVar7 << 3) | uVar20;
        uVar23 = uVar21;
        if (uVar21 <= uVar22 && uVar22 - uVar21 != 0) {
          uVar60 = -uVar113;
          if (0 < (int)uVar113) {
            uVar60 = uVar113;
          }
          uVar26 = 0xff;
          if (uVar60 < 0xff) {
            uVar26 = uVar60;
          }
          uVar23 = uVar22;
          if (uVar113 != 0) {
            uVar18 = uVar22 - uVar21 >> 2;
            if (uVar60 < 0xff) {
              auVar70 = pshuflw(ZEXT416(uVar26),ZEXT416(uVar26),0);
              auVar57._0_4_ = auVar70._0_4_;
              auVar57._4_4_ = auVar57._0_4_;
              auVar57._8_4_ = auVar57._0_4_;
              auVar57._12_4_ = auVar57._0_4_;
              sVar67 = auVar70._0_2_;
              sVar79 = auVar70._2_2_;
              auVar57 = auVar57 ^ auVar45;
              sVar83 = sVar67 * sVar36 + sVar84;
              sVar88 = sVar79 * sVar38 + sVar89;
              sVar90 = sVar67 * sVar39 + sVar91;
              sVar92 = sVar79 * sVar40 + sVar93;
              sVar94 = sVar67 * sVar41 + sVar95;
              sVar96 = sVar79 * sVar42 + sVar97;
              sVar98 = sVar67 * sVar43 + sVar99;
              sVar100 = sVar79 * sVar44 + sVar101;
              while( true ) {
                sVar81 = auVar57._0_2_;
                sVar58 = auVar57._2_2_;
                sVar59 = auVar57._4_2_;
                sVar61 = auVar57._6_2_;
                sVar62 = auVar57._8_2_;
                sVar63 = auVar57._10_2_;
                sVar64 = auVar57._12_2_;
                sVar66 = auVar57._14_2_;
                if (uVar18 < 2) break;
                auVar70 = *(undefined1 (*) [16])(lVar33 + uVar21 * 4);
                auVar85 = *(undefined1 (*) [16])(lVar33 + 0x10 + uVar21 * 4);
                auVar105 = pmovzxbw(in_XMM13,auVar70);
                auVar118 = pmovzxbw(in_XMM15,auVar85);
                auVar114._0_2_ = (ushort)auVar70[8] * sVar81 + sVar83;
                auVar114._2_2_ = (ushort)auVar70[9] * sVar58 + sVar88;
                auVar114._4_2_ = (ushort)auVar70[10] * sVar59 + sVar90;
                auVar114._6_2_ = (ushort)auVar70[0xb] * sVar61 + sVar92;
                auVar114._8_2_ = (ushort)auVar70[0xc] * sVar62 + sVar94;
                auVar114._10_2_ = (ushort)auVar70[0xd] * sVar63 + sVar96;
                auVar114._12_2_ = (ushort)auVar70[0xe] * sVar64 + sVar98;
                auVar114._14_2_ = (ushort)auVar70[0xf] * sVar66 + sVar100;
                auVar115 = pmulhuw(auVar114,auVar15);
                auVar102._0_2_ = (ushort)auVar85[8] * sVar81 + sVar83;
                auVar102._2_2_ = (ushort)auVar85[9] * sVar58 + sVar88;
                auVar102._4_2_ = (ushort)auVar85[10] * sVar59 + sVar90;
                auVar102._6_2_ = (ushort)auVar85[0xb] * sVar61 + sVar92;
                auVar102._8_2_ = (ushort)auVar85[0xc] * sVar62 + sVar94;
                auVar102._10_2_ = (ushort)auVar85[0xd] * sVar63 + sVar96;
                auVar102._12_2_ = (ushort)auVar85[0xe] * sVar64 + sVar98;
                auVar102._14_2_ = (ushort)auVar85[0xf] * sVar66 + sVar100;
                auVar70 = pmulhuw(auVar102,auVar15);
                auVar106._0_2_ = auVar105._0_2_ * sVar81 + sVar83;
                auVar106._2_2_ = auVar105._2_2_ * sVar58 + sVar88;
                auVar106._4_2_ = auVar105._4_2_ * sVar59 + sVar90;
                auVar106._6_2_ = auVar105._6_2_ * sVar61 + sVar92;
                auVar106._8_2_ = auVar105._8_2_ * sVar62 + sVar94;
                auVar106._10_2_ = auVar105._10_2_ * sVar63 + sVar96;
                auVar106._12_2_ = auVar105._12_2_ * sVar64 + sVar98;
                auVar106._14_2_ = auVar105._14_2_ * sVar66 + sVar100;
                auVar85 = pmulhuw(auVar106,auVar15);
                sVar8 = auVar85._0_2_;
                sVar9 = auVar85._2_2_;
                in_XMM13[1] = (0 < sVar9) * (sVar9 < 0x100) * auVar85[2] - (0xff < sVar9);
                in_XMM13[0] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[0] - (0xff < sVar8);
                sVar8 = auVar85._4_2_;
                in_XMM13[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[4] - (0xff < sVar8);
                sVar8 = auVar85._6_2_;
                in_XMM13[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[6] - (0xff < sVar8);
                sVar8 = auVar85._8_2_;
                in_XMM13[4] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[8] - (0xff < sVar8);
                sVar8 = auVar85._10_2_;
                in_XMM13[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[10] - (0xff < sVar8);
                sVar8 = auVar85._12_2_;
                in_XMM13[6] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[0xc] - (0xff < sVar8);
                sVar8 = auVar85._14_2_;
                in_XMM13[7] = (0 < sVar8) * (sVar8 < 0x100) * auVar85[0xe] - (0xff < sVar8);
                sVar8 = auVar115._0_2_;
                in_XMM13[8] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[0] - (0xff < sVar8);
                sVar8 = auVar115._2_2_;
                in_XMM13[9] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[2] - (0xff < sVar8);
                sVar8 = auVar115._4_2_;
                in_XMM13[10] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[4] - (0xff < sVar8);
                sVar8 = auVar115._6_2_;
                in_XMM13[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[6] - (0xff < sVar8);
                sVar8 = auVar115._8_2_;
                in_XMM13[0xc] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[8] - (0xff < sVar8);
                sVar8 = auVar115._10_2_;
                in_XMM13[0xd] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[10] - (0xff < sVar8);
                sVar8 = auVar115._12_2_;
                in_XMM13[0xe] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[0xc] - (0xff < sVar8);
                sVar8 = auVar115._14_2_;
                in_XMM13[0xf] = (0 < sVar8) * (sVar8 < 0x100) * auVar115[0xe] - (0xff < sVar8);
                auVar119._0_2_ = auVar118._0_2_ * sVar81 + sVar83;
                auVar119._2_2_ = auVar118._2_2_ * sVar58 + sVar88;
                auVar119._4_2_ = auVar118._4_2_ * sVar59 + sVar90;
                auVar119._6_2_ = auVar118._6_2_ * sVar61 + sVar92;
                auVar119._8_2_ = auVar118._8_2_ * sVar62 + sVar94;
                auVar119._10_2_ = auVar118._10_2_ * sVar63 + sVar96;
                auVar119._12_2_ = auVar118._12_2_ * sVar64 + sVar98;
                auVar119._14_2_ = auVar118._14_2_ * sVar66 + sVar100;
                auVar85 = pmulhuw(auVar119,auVar15);
                sVar81 = auVar85._0_2_;
                sVar58 = auVar85._2_2_;
                in_XMM15[1] = (0 < sVar58) * (sVar58 < 0x100) * auVar85[2] - (0xff < sVar58);
                in_XMM15[0] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[0] - (0xff < sVar81);
                sVar81 = auVar85._4_2_;
                in_XMM15[2] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[4] - (0xff < sVar81);
                sVar81 = auVar85._6_2_;
                in_XMM15[3] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[6] - (0xff < sVar81);
                sVar81 = auVar85._8_2_;
                in_XMM15[4] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[8] - (0xff < sVar81);
                sVar81 = auVar85._10_2_;
                in_XMM15[5] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[10] - (0xff < sVar81);
                sVar81 = auVar85._12_2_;
                in_XMM15[6] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[0xc] - (0xff < sVar81);
                sVar81 = auVar85._14_2_;
                in_XMM15[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[0xe] - (0xff < sVar81);
                sVar81 = auVar70._0_2_;
                in_XMM15[8] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[0] - (0xff < sVar81);
                sVar81 = auVar70._2_2_;
                in_XMM15[9] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[2] - (0xff < sVar81);
                sVar81 = auVar70._4_2_;
                in_XMM15[10] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[4] - (0xff < sVar81);
                sVar81 = auVar70._6_2_;
                in_XMM15[0xb] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[6] - (0xff < sVar81);
                sVar81 = auVar70._8_2_;
                in_XMM15[0xc] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[8] - (0xff < sVar81);
                sVar81 = auVar70._10_2_;
                in_XMM15[0xd] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[10] - (0xff < sVar81);
                sVar81 = auVar70._12_2_;
                in_XMM15[0xe] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[0xc] - (0xff < sVar81);
                sVar81 = auVar70._14_2_;
                in_XMM15[0xf] = (0 < sVar81) * (sVar81 < 0x100) * auVar70[0xe] - (0xff < sVar81);
                *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = in_XMM13;
                *(undefined1 (*) [16])(lVar33 + 0x10 + uVar21 * 4) = in_XMM15;
                uVar21 = uVar21 + 8;
                uVar18 = uVar18 - 2;
              }
              if (uVar18 != 0) {
                auVar70 = *(undefined1 (*) [16])(lVar33 + uVar21 * 4);
                auVar85 = pmovzxbw(in_XMM13,auVar70);
                auVar103._0_2_ = (ushort)auVar70[8] * sVar81 + sVar83;
                auVar103._2_2_ = (ushort)auVar70[9] * sVar58 + sVar88;
                auVar103._4_2_ = (ushort)auVar70[10] * sVar59 + sVar90;
                auVar103._6_2_ = (ushort)auVar70[0xb] * sVar61 + sVar92;
                auVar103._8_2_ = (ushort)auVar70[0xc] * sVar62 + sVar94;
                auVar103._10_2_ = (ushort)auVar70[0xd] * sVar63 + sVar96;
                auVar103._12_2_ = (ushort)auVar70[0xe] * sVar64 + sVar98;
                auVar103._14_2_ = (ushort)auVar70[0xf] * sVar66 + sVar100;
                auVar70 = pmulhuw(auVar103,auVar15);
                auVar108._0_2_ = auVar85._0_2_ * sVar81 + sVar83;
                auVar108._2_2_ = auVar85._2_2_ * sVar58 + sVar88;
                auVar108._4_2_ = auVar85._4_2_ * sVar59 + sVar90;
                auVar108._6_2_ = auVar85._6_2_ * sVar61 + sVar92;
                auVar108._8_2_ = auVar85._8_2_ * sVar62 + sVar94;
                auVar108._10_2_ = auVar85._10_2_ * sVar63 + sVar96;
                auVar108._12_2_ = auVar85._12_2_ * sVar64 + sVar98;
                auVar108._14_2_ = auVar85._14_2_ * sVar66 + sVar100;
                auVar85 = pmulhuw(auVar108,auVar15);
                sVar83 = auVar85._0_2_;
                sVar88 = auVar85._2_2_;
                in_XMM13[1] = (0 < sVar88) * (sVar88 < 0x100) * auVar85[2] - (0xff < sVar88);
                in_XMM13[0] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[0] - (0xff < sVar83);
                sVar83 = auVar85._4_2_;
                in_XMM13[2] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[4] - (0xff < sVar83);
                sVar83 = auVar85._6_2_;
                in_XMM13[3] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[6] - (0xff < sVar83);
                sVar83 = auVar85._8_2_;
                in_XMM13[4] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[8] - (0xff < sVar83);
                sVar83 = auVar85._10_2_;
                in_XMM13[5] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[10] - (0xff < sVar83);
                sVar83 = auVar85._12_2_;
                in_XMM13[6] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[0xc] - (0xff < sVar83);
                sVar83 = auVar85._14_2_;
                in_XMM13[7] = (0 < sVar83) * (sVar83 < 0x100) * auVar85[0xe] - (0xff < sVar83);
                sVar83 = auVar70._0_2_;
                in_XMM13[8] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[0] - (0xff < sVar83);
                sVar83 = auVar70._2_2_;
                in_XMM13[9] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[2] - (0xff < sVar83);
                sVar83 = auVar70._4_2_;
                in_XMM13[10] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[4] - (0xff < sVar83);
                sVar83 = auVar70._6_2_;
                in_XMM13[0xb] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[6] - (0xff < sVar83);
                sVar83 = auVar70._8_2_;
                in_XMM13[0xc] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[8] - (0xff < sVar83);
                sVar83 = auVar70._10_2_;
                in_XMM13[0xd] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[10] - (0xff < sVar83);
                sVar83 = auVar70._12_2_;
                in_XMM13[0xe] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[0xc] - (0xff < sVar83);
                sVar83 = auVar70._14_2_;
                in_XMM13[0xf] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[0xe] - (0xff < sVar83);
                *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = in_XMM13;
                uVar21 = uVar21 + 4;
              }
              for (; uVar21 < uVar22; uVar21 = uVar21 + 1) {
                auVar70 = ZEXT416(*(uint *)(lVar33 + uVar21 * 4));
                auVar70 = pmovzxbw(auVar70,auVar70);
                auVar87._0_2_ = auVar70._0_2_ * sVar81 + sVar67 * sVar36 + sVar47;
                auVar87._2_2_ = auVar70._2_2_ * sVar58 + sVar79 * sVar38 + sVar49;
                auVar87._4_2_ = auVar70._4_2_ * sVar59 + sVar67 * sVar39 + sVar50;
                auVar87._6_2_ = auVar70._6_2_ * sVar61 + sVar79 * sVar40 + sVar51;
                auVar87._8_2_ = auVar70._8_2_ * sVar62 + sVar67 * sVar41 + sVar52;
                auVar87._10_2_ = auVar70._10_2_ * sVar63 + sVar79 * sVar42 + sVar53;
                auVar87._12_2_ = auVar70._12_2_ * sVar64 + sVar67 * sVar43 + sVar54;
                auVar87._14_2_ = auVar70._14_2_ * sVar66 + sVar79 * sVar44 + sVar55;
                auVar70 = pmulhuw(auVar87,auVar16);
                sVar83 = auVar70._0_2_;
                sVar88 = auVar70._2_2_;
                sVar90 = auVar70._4_2_;
                sVar92 = auVar70._6_2_;
                *(uint *)(lVar33 + uVar21 * 4) =
                     CONCAT13((0 < sVar92) * (sVar92 < 0x100) * auVar70[6] - (0xff < sVar92),
                              CONCAT12((0 < sVar90) * (sVar90 < 0x100) * auVar70[4] -
                                       (0xff < sVar90),
                                       CONCAT11((0 < sVar88) * (sVar88 < 0x100) * auVar70[2] -
                                                (0xff < sVar88),
                                                (0 < sVar83) * (sVar83 < 0x100) * auVar70[0] -
                                                (0xff < sVar83))));
              }
            }
            else {
              puVar24 = (uint32_t *)(lVar33 + uVar21 * 4);
              for (; 7 < uVar18; uVar18 = uVar18 - 8) {
                *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x10 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x20 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x30 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x40 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x50 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x60 + uVar21 * 4) = auVar35;
                *(undefined1 (*) [16])(lVar33 + 0x70 + uVar21 * 4) = auVar35;
                uVar21 = uVar21 + 0x20;
                puVar24 = puVar24 + 0x20;
              }
              for (uVar27 = 0; uVar18 != uVar27; uVar27 = uVar27 + 1) {
                *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = auVar35;
                uVar21 = uVar21 + 4;
                puVar24 = puVar24 + 4;
              }
              for (; uVar21 < uVar22; uVar21 = uVar21 + 1) {
                *puVar24 = uVar17;
                puVar24 = puVar24 + 1;
              }
            }
          }
        }
        if (uVar25 == uVar31) {
          uVar21 = (long)*(int *)(this + 0x30);
          if (uVar28 < (ulong)(long)*(int *)(this + 0x30)) {
            uVar21 = uVar28;
          }
          uVar25 = 0;
        }
        else {
          uVar31 = uVar31 ^ uVar25;
          lVar7 = 0;
          if (uVar31 != 0) {
            for (; (uVar31 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          uVar25 = -1L << ((byte)lVar7 & 0x3f) ^ uVar31;
          uVar21 = (uint)((int)lVar7 << 3) | uVar20;
        }
        sVar67 = auVar45._0_2_;
        sVar79 = auVar45._2_2_;
        sVar83 = auVar45._4_2_;
        sVar88 = auVar45._6_2_;
        sVar90 = auVar45._8_2_;
        sVar92 = auVar45._10_2_;
        sVar94 = auVar45._12_2_;
        sVar96 = auVar45._14_2_;
        uVar60 = 0;
        uVar26 = 0;
        uVar65 = 0;
        if (3 < uVar21 - uVar23) {
          uVar22 = uVar21 - uVar23 >> 2;
          while (bVar34 = uVar22 != 0, uVar22 = uVar22 - 1, uVar60 = uVar113, uVar26 = uVar113,
                uVar65 = uVar113, bVar34) {
            piVar1 = (int *)(lVar32 + uVar23 * 8);
            iVar5 = *piVar1;
            piVar3 = (int *)(lVar32 + 0x10 + uVar23 * 8);
            iVar110 = iVar5 + piVar1[2];
            auVar14._4_4_ = iVar110;
            auVar14._0_4_ = iVar5;
            auVar69._0_4_ = piVar1[1] >> 9;
            auVar69._4_4_ = piVar1[3] >> 9;
            auVar69._8_4_ = piVar3[1] >> 9;
            auVar69._12_4_ = piVar3[3] >> 9;
            auVar14._8_8_ = 0;
            iVar104 = iVar5 + uVar113;
            iVar111 = iVar110 + uVar113;
            iVar112 = piVar1[2] + *piVar3 + uVar113;
            uVar113 = *piVar3 + piVar3[2] + uVar113 + iVar110;
            auVar107._0_4_ = iVar104 - auVar69._0_4_;
            auVar107._4_4_ = iVar111 - auVar69._4_4_;
            auVar107._8_4_ = (iVar112 + iVar5) - auVar69._8_4_;
            auVar107._12_4_ = uVar113 - auVar69._12_4_;
            auVar70 = pabsd(auVar69,auVar107);
            auVar70 = packssdw(auVar70,auVar70);
            sVar98 = auVar70._0_2_;
            sVar100 = auVar70._2_2_;
            sVar81 = auVar70._4_2_;
            uVar80 = (ushort)(sVar83 < sVar81) * sVar83 | (ushort)(sVar83 >= sVar81) * sVar81;
            sVar81 = auVar70._6_2_;
            uVar82 = (ushort)(sVar88 < sVar81) * sVar88 | (ushort)(sVar88 >= sVar81) * sVar81;
            auVar72._0_8_ =
                 CONCAT26(uVar82,CONCAT24(uVar80,CONCAT22((ushort)(sVar79 < sVar100) * sVar79 |
                                                          (ushort)(sVar79 >= sVar100) * sVar100,
                                                          (ushort)(sVar67 < sVar98) * sVar67 |
                                                          (ushort)(sVar67 >= sVar98) * sVar98)));
            sVar98 = auVar70._8_2_;
            auVar68._0_10_ =
                 CONCAT28((ushort)(sVar90 < sVar98) * sVar90 | (ushort)(sVar90 >= sVar98) * sVar98,
                          auVar72._0_8_);
            sVar98 = auVar70._10_2_;
            auVar68._10_2_ =
                 (ushort)(sVar92 < sVar98) * sVar92 | (ushort)(sVar92 >= sVar98) * sVar98;
            sVar98 = auVar70._12_2_;
            sVar100 = auVar70._14_2_;
            auVar71._12_2_ =
                 (ushort)(sVar94 < sVar98) * sVar94 | (ushort)(sVar94 >= sVar98) * sVar98;
            auVar71._0_12_ = auVar68;
            auVar71._14_2_ =
                 (ushort)(sVar96 < sVar100) * sVar96 | (ushort)(sVar96 >= sVar100) * sVar100;
            auVar85 = pshuflw(auVar14 << 0x40,auVar71,0x50);
            auVar74._12_2_ = uVar82;
            auVar74._0_12_ = auVar68;
            auVar74._14_2_ = uVar82;
            auVar73._12_4_ = auVar74._12_4_;
            auVar73._10_2_ = uVar80;
            auVar73._0_10_ = auVar68._0_10_;
            auVar72._10_6_ = auVar73._10_6_;
            auVar72._8_2_ = uVar80;
            *(undefined1 (*) [16])(lVar32 + uVar23 * 8) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(lVar32 + 0x10 + uVar23 * 8) = (undefined1  [16])0x0;
            auVar70 = *(undefined1 (*) [16])(lVar33 + uVar23 * 4);
            in_XMM13 = pmovzxbw(auVar107,auVar70);
            auVar86._0_4_ = auVar85._0_4_;
            auVar86._4_4_ = auVar86._0_4_;
            auVar86._8_4_ = auVar85._4_4_;
            auVar86._12_4_ = auVar85._4_4_;
            auVar75._4_4_ = auVar72._8_4_;
            auVar75._0_4_ = auVar72._8_4_;
            auVar75._8_4_ = auVar73._12_4_;
            auVar75._12_4_ = auVar73._12_4_;
            auVar86 = auVar86 ^ auVar45;
            auVar75 = auVar75 ^ auVar45;
            auVar116._0_2_ = auVar85._0_2_ * sVar36 + sVar84 + auVar86._0_2_ * in_XMM13._0_2_;
            auVar116._2_2_ = auVar85._2_2_ * sVar38 + sVar89 + auVar86._2_2_ * in_XMM13._2_2_;
            auVar116._4_2_ = auVar85._0_2_ * sVar39 + sVar91 + auVar86._4_2_ * in_XMM13._4_2_;
            auVar116._6_2_ = auVar85._2_2_ * sVar40 + sVar93 + auVar86._6_2_ * in_XMM13._6_2_;
            auVar116._8_2_ = auVar85._4_2_ * sVar41 + sVar95 + auVar86._8_2_ * in_XMM13._8_2_;
            auVar116._10_2_ = auVar85._6_2_ * sVar42 + sVar97 + auVar86._10_2_ * in_XMM13._10_2_;
            auVar116._12_2_ = auVar85._4_2_ * sVar43 + sVar99 + auVar86._12_2_ * in_XMM13._12_2_;
            auVar116._14_2_ = auVar85._6_2_ * sVar44 + sVar101 + auVar86._14_2_ * in_XMM13._14_2_;
            auVar85 = pmulhuw(auVar116,auVar15);
            auVar120._0_2_ = uVar80 * sVar36 + sVar84 + auVar75._0_2_ * (ushort)auVar70[8];
            auVar120._2_2_ = uVar80 * sVar38 + sVar89 + auVar75._2_2_ * (ushort)auVar70[9];
            auVar120._4_2_ = uVar80 * sVar39 + sVar91 + auVar75._4_2_ * (ushort)auVar70[10];
            auVar120._6_2_ = uVar80 * sVar40 + sVar93 + auVar75._6_2_ * (ushort)auVar70[0xb];
            auVar120._8_2_ = uVar82 * sVar41 + sVar95 + auVar75._8_2_ * (ushort)auVar70[0xc];
            auVar120._10_2_ = uVar82 * sVar42 + sVar97 + auVar75._10_2_ * (ushort)auVar70[0xd];
            auVar120._12_2_ = uVar82 * sVar43 + sVar99 + auVar75._12_2_ * (ushort)auVar70[0xe];
            auVar120._14_2_ = uVar82 * sVar44 + sVar101 + auVar75._14_2_ * (ushort)auVar70[0xf];
            in_XMM15 = pmulhuw(auVar120,auVar15);
            sVar98 = auVar85._0_2_;
            sVar100 = auVar85._2_2_;
            sVar81 = auVar85._4_2_;
            sVar58 = auVar85._6_2_;
            sVar59 = auVar85._8_2_;
            sVar61 = auVar85._10_2_;
            sVar62 = auVar85._12_2_;
            sVar63 = auVar85._14_2_;
            sVar64 = in_XMM15._0_2_;
            sVar66 = in_XMM15._2_2_;
            sVar8 = in_XMM15._4_2_;
            sVar9 = in_XMM15._6_2_;
            sVar10 = in_XMM15._8_2_;
            sVar11 = in_XMM15._10_2_;
            sVar12 = in_XMM15._12_2_;
            sVar13 = in_XMM15._14_2_;
            pcVar2 = (char *)(lVar33 + uVar23 * 4);
            *pcVar2 = (0 < sVar98) * (sVar98 < 0x100) * auVar85[0] - (0xff < sVar98);
            pcVar2[1] = (0 < sVar100) * (sVar100 < 0x100) * auVar85[2] - (0xff < sVar100);
            pcVar2[2] = (0 < sVar81) * (sVar81 < 0x100) * auVar85[4] - (0xff < sVar81);
            pcVar2[3] = (0 < sVar58) * (sVar58 < 0x100) * auVar85[6] - (0xff < sVar58);
            pcVar2[4] = (0 < sVar59) * (sVar59 < 0x100) * auVar85[8] - (0xff < sVar59);
            pcVar2[5] = (0 < sVar61) * (sVar61 < 0x100) * auVar85[10] - (0xff < sVar61);
            pcVar2[6] = (0 < sVar62) * (sVar62 < 0x100) * auVar85[0xc] - (0xff < sVar62);
            pcVar2[7] = (0 < sVar63) * (sVar63 < 0x100) * auVar85[0xe] - (0xff < sVar63);
            pcVar2[8] = (0 < sVar64) * (sVar64 < 0x100) * in_XMM15[0] - (0xff < sVar64);
            pcVar2[9] = (0 < sVar66) * (sVar66 < 0x100) * in_XMM15[2] - (0xff < sVar66);
            pcVar2[10] = (0 < sVar8) * (sVar8 < 0x100) * in_XMM15[4] - (0xff < sVar8);
            pcVar2[0xb] = (0 < sVar9) * (sVar9 < 0x100) * in_XMM15[6] - (0xff < sVar9);
            pcVar2[0xc] = (0 < sVar10) * (sVar10 < 0x100) * in_XMM15[8] - (0xff < sVar10);
            pcVar2[0xd] = (0 < sVar11) * (sVar11 < 0x100) * in_XMM15[10] - (0xff < sVar11);
            pcVar2[0xe] = (0 < sVar12) * (sVar12 < 0x100) * in_XMM15[0xc] - (0xff < sVar12);
            pcVar2[0xf] = (0 < sVar13) * (sVar13 < 0x100) * in_XMM15[0xe] - (0xff < sVar13);
            uVar23 = uVar23 + 4;
          }
        }
        for (; uVar23 < uVar21; uVar23 = uVar23 + 1) {
          iVar5 = *(int *)(lVar32 + uVar23 * 8);
          *(undefined8 *)(lVar32 + uVar23 * 8) = 0;
          uVar113 = uVar113 + iVar5;
          auVar76._0_4_ = uVar113 - (*(int *)(lVar32 + 4 + uVar23 * 8) >> 9);
          auVar76._4_4_ = uVar60;
          auVar76._8_4_ = uVar26;
          auVar76._12_4_ = uVar65;
          auVar70 = pabsd(auVar76,auVar76);
          auVar70 = packssdw(auVar70,auVar70);
          auVar85 = ZEXT416(*(uint *)(lVar33 + uVar23 * 4));
          auVar70 = pshuflw(auVar70,auVar70,0);
          sVar84 = auVar70._0_2_;
          auVar77._0_2_ = (ushort)(sVar67 < sVar84) * sVar67 | (ushort)(sVar67 >= sVar84) * sVar84;
          sVar84 = auVar70._2_2_;
          auVar77._2_2_ = (ushort)(sVar79 < sVar84) * sVar79 | (ushort)(sVar79 >= sVar84) * sVar84;
          sVar84 = auVar70._4_2_;
          auVar77._4_2_ = (ushort)(sVar83 < sVar84) * sVar83 | (ushort)(sVar83 >= sVar84) * sVar84;
          sVar84 = auVar70._6_2_;
          auVar77._6_2_ = (ushort)(sVar88 < sVar84) * sVar88 | (ushort)(sVar88 >= sVar84) * sVar84;
          sVar84 = auVar70._8_2_;
          auVar77._8_2_ = (ushort)(sVar90 < sVar84) * sVar90 | (ushort)(sVar90 >= sVar84) * sVar84;
          sVar84 = auVar70._10_2_;
          auVar77._10_2_ = (ushort)(sVar92 < sVar84) * sVar92 | (ushort)(sVar92 >= sVar84) * sVar84;
          sVar84 = auVar70._12_2_;
          sVar89 = auVar70._14_2_;
          auVar77._12_2_ = (ushort)(sVar94 < sVar84) * sVar94 | (ushort)(sVar94 >= sVar84) * sVar84;
          auVar77._14_2_ = (ushort)(sVar96 < sVar89) * sVar96 | (ushort)(sVar96 >= sVar89) * sVar89;
          auVar85 = pmovzxbw(auVar85,auVar85);
          auVar70 = auVar77 ^ auVar56;
          auVar78._0_2_ = auVar70._0_2_ * auVar85._0_2_ + auVar77._0_2_ * sVar36 + sVar47;
          auVar78._2_2_ = auVar70._2_2_ * auVar85._2_2_ + auVar77._2_2_ * sVar38 + sVar49;
          auVar78._4_2_ = auVar70._4_2_ * auVar85._4_2_ + auVar77._4_2_ * sVar39 + sVar50;
          auVar78._6_2_ = auVar70._6_2_ * auVar85._6_2_ + auVar77._6_2_ * sVar40 + sVar51;
          auVar78._8_2_ = auVar70._8_2_ * auVar85._8_2_ + auVar77._8_2_ * sVar41 + sVar52;
          auVar78._10_2_ = auVar70._10_2_ * auVar85._10_2_ + auVar77._10_2_ * sVar42 + sVar53;
          auVar78._12_2_ = auVar70._12_2_ * auVar85._12_2_ + auVar77._12_2_ * sVar43 + sVar54;
          auVar78._14_2_ = auVar70._14_2_ * auVar85._14_2_ + auVar77._14_2_ * sVar44 + sVar55;
          auVar70 = pmulhuw(auVar78,auVar16);
          sVar84 = auVar70._0_2_;
          sVar89 = auVar70._2_2_;
          sVar91 = auVar70._4_2_;
          sVar93 = auVar70._6_2_;
          *(uint *)(lVar33 + uVar23 * 4) =
               CONCAT13((0 < sVar93) * (sVar93 < 0x100) * auVar70[6] - (0xff < sVar93),
                        CONCAT12((0 < sVar91) * (sVar91 < 0x100) * auVar70[4] - (0xff < sVar91),
                                 CONCAT11((0 < sVar89) * (sVar89 < 0x100) * auVar70[2] -
                                          (0xff < sVar89),
                                          (0 < sVar84) * (sVar84 < 0x100) * auVar70[0] -
                                          (0xff < sVar84))));
        }
      }
      puVar30 = puVar30 + 1;
      lVar19 = lVar19 + -1;
      uVar20 = uVar28;
    } while (lVar19 != 0);
    uVar20 = (ulong)*(int *)(this + 0x30);
    uVar28 = uVar20 - uVar21;
    if (uVar21 <= uVar20 && uVar28 != 0) {
      uVar60 = -uVar113;
      if (0 < (int)uVar113) {
        uVar60 = uVar113;
      }
      uVar26 = 0xff;
      if (uVar60 < 0xff) {
        uVar26 = uVar60;
      }
      if (uVar113 != 0) {
        uVar25 = uVar28 >> 2;
        if (uVar60 < 0xff) {
          auVar70 = pshuflw(ZEXT416(uVar26),ZEXT416(uVar26),0);
          auVar85._0_4_ = auVar70._0_4_;
          auVar85._4_4_ = auVar85._0_4_;
          auVar85._8_4_ = auVar85._0_4_;
          auVar85._12_4_ = auVar85._0_4_;
          sVar67 = auVar70._0_2_;
          sVar79 = auVar70._2_2_;
          auVar85 = auVar85 ^ auVar45;
          sVar84 = sVar67 * sVar36 + sVar84;
          sVar89 = sVar79 * sVar38 + sVar89;
          sVar91 = sVar67 * sVar39 + sVar91;
          sVar93 = sVar79 * sVar40 + sVar93;
          sVar95 = sVar67 * sVar41 + sVar95;
          sVar97 = sVar79 * sVar42 + sVar97;
          sVar99 = sVar67 * sVar43 + sVar99;
          sVar101 = sVar79 * sVar44 + sVar101;
          uVar23 = uVar25;
          while( true ) {
            sVar83 = auVar85._0_2_;
            sVar88 = auVar85._2_2_;
            sVar90 = auVar85._4_2_;
            sVar92 = auVar85._6_2_;
            sVar94 = auVar85._8_2_;
            sVar96 = auVar85._10_2_;
            sVar98 = auVar85._12_2_;
            sVar100 = auVar85._14_2_;
            if (uVar23 < 2) break;
            auVar70 = *(undefined1 (*) [16])(lVar33 + uVar21 * 4);
            auVar105 = *(undefined1 (*) [16])(lVar33 + 0x10 + uVar21 * 4);
            auVar115 = pmovzxbw(in_XMM13,auVar70);
            auVar57 = pmovzxbw(in_XMM15,auVar105);
            auVar117._0_2_ = (ushort)auVar70[8] * sVar83 + sVar84;
            auVar117._2_2_ = (ushort)auVar70[9] * sVar88 + sVar89;
            auVar117._4_2_ = (ushort)auVar70[10] * sVar90 + sVar91;
            auVar117._6_2_ = (ushort)auVar70[0xb] * sVar92 + sVar93;
            auVar117._8_2_ = (ushort)auVar70[0xc] * sVar94 + sVar95;
            auVar117._10_2_ = (ushort)auVar70[0xd] * sVar96 + sVar97;
            auVar117._12_2_ = (ushort)auVar70[0xe] * sVar98 + sVar99;
            auVar117._14_2_ = (ushort)auVar70[0xf] * sVar100 + sVar101;
            auVar118 = pmulhuw(auVar117,auVar15);
            auVar70._0_2_ = (ushort)auVar105[8] * sVar83 + sVar84;
            auVar70._2_2_ = (ushort)auVar105[9] * sVar88 + sVar89;
            auVar70._4_2_ = (ushort)auVar105[10] * sVar90 + sVar91;
            auVar70._6_2_ = (ushort)auVar105[0xb] * sVar92 + sVar93;
            auVar70._8_2_ = (ushort)auVar105[0xc] * sVar94 + sVar95;
            auVar70._10_2_ = (ushort)auVar105[0xd] * sVar96 + sVar97;
            auVar70._12_2_ = (ushort)auVar105[0xe] * sVar98 + sVar99;
            auVar70._14_2_ = (ushort)auVar105[0xf] * sVar100 + sVar101;
            auVar70 = pmulhuw(auVar70,auVar15);
            auVar109._0_2_ = auVar115._0_2_ * sVar83 + sVar84;
            auVar109._2_2_ = auVar115._2_2_ * sVar88 + sVar89;
            auVar109._4_2_ = auVar115._4_2_ * sVar90 + sVar91;
            auVar109._6_2_ = auVar115._6_2_ * sVar92 + sVar93;
            auVar109._8_2_ = auVar115._8_2_ * sVar94 + sVar95;
            auVar109._10_2_ = auVar115._10_2_ * sVar96 + sVar97;
            auVar109._12_2_ = auVar115._12_2_ * sVar98 + sVar99;
            auVar109._14_2_ = auVar115._14_2_ * sVar100 + sVar101;
            auVar105 = pmulhuw(auVar109,auVar15);
            sVar81 = auVar105._0_2_;
            sVar58 = auVar105._2_2_;
            in_XMM13[1] = (0 < sVar58) * (sVar58 < 0x100) * auVar105[2] - (0xff < sVar58);
            in_XMM13[0] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[0] - (0xff < sVar81);
            sVar81 = auVar105._4_2_;
            in_XMM13[2] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[4] - (0xff < sVar81);
            sVar81 = auVar105._6_2_;
            in_XMM13[3] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[6] - (0xff < sVar81);
            sVar81 = auVar105._8_2_;
            in_XMM13[4] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[8] - (0xff < sVar81);
            sVar81 = auVar105._10_2_;
            in_XMM13[5] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[10] - (0xff < sVar81);
            sVar81 = auVar105._12_2_;
            in_XMM13[6] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[0xc] - (0xff < sVar81);
            sVar81 = auVar105._14_2_;
            in_XMM13[7] = (0 < sVar81) * (sVar81 < 0x100) * auVar105[0xe] - (0xff < sVar81);
            sVar81 = auVar118._0_2_;
            in_XMM13[8] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[0] - (0xff < sVar81);
            sVar81 = auVar118._2_2_;
            in_XMM13[9] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[2] - (0xff < sVar81);
            sVar81 = auVar118._4_2_;
            in_XMM13[10] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[4] - (0xff < sVar81);
            sVar81 = auVar118._6_2_;
            in_XMM13[0xb] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[6] - (0xff < sVar81);
            sVar81 = auVar118._8_2_;
            in_XMM13[0xc] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[8] - (0xff < sVar81);
            sVar81 = auVar118._10_2_;
            in_XMM13[0xd] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[10] - (0xff < sVar81);
            sVar81 = auVar118._12_2_;
            in_XMM13[0xe] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[0xc] - (0xff < sVar81);
            sVar81 = auVar118._14_2_;
            in_XMM13[0xf] = (0 < sVar81) * (sVar81 < 0x100) * auVar118[0xe] - (0xff < sVar81);
            auVar121._0_2_ = auVar57._0_2_ * sVar83 + sVar84;
            auVar121._2_2_ = auVar57._2_2_ * sVar88 + sVar89;
            auVar121._4_2_ = auVar57._4_2_ * sVar90 + sVar91;
            auVar121._6_2_ = auVar57._6_2_ * sVar92 + sVar93;
            auVar121._8_2_ = auVar57._8_2_ * sVar94 + sVar95;
            auVar121._10_2_ = auVar57._10_2_ * sVar96 + sVar97;
            auVar121._12_2_ = auVar57._12_2_ * sVar98 + sVar99;
            auVar121._14_2_ = auVar57._14_2_ * sVar100 + sVar101;
            auVar105 = pmulhuw(auVar121,auVar15);
            sVar83 = auVar105._0_2_;
            sVar88 = auVar105._2_2_;
            in_XMM15[1] = (0 < sVar88) * (sVar88 < 0x100) * auVar105[2] - (0xff < sVar88);
            in_XMM15[0] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[0] - (0xff < sVar83);
            sVar83 = auVar105._4_2_;
            in_XMM15[2] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[4] - (0xff < sVar83);
            sVar83 = auVar105._6_2_;
            in_XMM15[3] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[6] - (0xff < sVar83);
            sVar83 = auVar105._8_2_;
            in_XMM15[4] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[8] - (0xff < sVar83);
            sVar83 = auVar105._10_2_;
            in_XMM15[5] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[10] - (0xff < sVar83);
            sVar83 = auVar105._12_2_;
            in_XMM15[6] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[0xc] - (0xff < sVar83);
            sVar83 = auVar105._14_2_;
            in_XMM15[7] = (0 < sVar83) * (sVar83 < 0x100) * auVar105[0xe] - (0xff < sVar83);
            sVar83 = auVar70._0_2_;
            in_XMM15[8] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[0] - (0xff < sVar83);
            sVar83 = auVar70._2_2_;
            in_XMM15[9] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[2] - (0xff < sVar83);
            sVar83 = auVar70._4_2_;
            in_XMM15[10] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[4] - (0xff < sVar83);
            sVar83 = auVar70._6_2_;
            in_XMM15[0xb] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[6] - (0xff < sVar83);
            sVar83 = auVar70._8_2_;
            in_XMM15[0xc] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[8] - (0xff < sVar83);
            sVar83 = auVar70._10_2_;
            in_XMM15[0xd] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[10] - (0xff < sVar83);
            sVar83 = auVar70._12_2_;
            in_XMM15[0xe] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[0xc] - (0xff < sVar83);
            sVar83 = auVar70._14_2_;
            in_XMM15[0xf] = (0 < sVar83) * (sVar83 < 0x100) * auVar70[0xe] - (0xff < sVar83);
            *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = in_XMM13;
            *(undefined1 (*) [16])(lVar33 + 0x10 + uVar21 * 4) = in_XMM15;
            uVar21 = uVar21 + 8;
            uVar23 = uVar23 - 2;
          }
          if (uVar25 != (uVar28 >> 2 & 0x3ffffffffffffffe)) {
            auVar70 = *(undefined1 (*) [16])(lVar33 + uVar21 * 4);
            auVar85 = pmovzxbw(in_XMM13,auVar70);
            auVar105._0_2_ = (ushort)auVar70[8] * sVar83 + sVar84;
            auVar105._2_2_ = (ushort)auVar70[9] * sVar88 + sVar89;
            auVar105._4_2_ = (ushort)auVar70[10] * sVar90 + sVar91;
            auVar105._6_2_ = (ushort)auVar70[0xb] * sVar92 + sVar93;
            auVar105._8_2_ = (ushort)auVar70[0xc] * sVar94 + sVar95;
            auVar105._10_2_ = (ushort)auVar70[0xd] * sVar96 + sVar97;
            auVar105._12_2_ = (ushort)auVar70[0xe] * sVar98 + sVar99;
            auVar105._14_2_ = (ushort)auVar70[0xf] * sVar100 + sVar101;
            auVar70 = pmulhuw(auVar105,auVar15);
            auVar115._0_2_ = auVar85._0_2_ * sVar83 + sVar84;
            auVar115._2_2_ = auVar85._2_2_ * sVar88 + sVar89;
            auVar115._4_2_ = auVar85._4_2_ * sVar90 + sVar91;
            auVar115._6_2_ = auVar85._6_2_ * sVar92 + sVar93;
            auVar115._8_2_ = auVar85._8_2_ * sVar94 + sVar95;
            auVar115._10_2_ = auVar85._10_2_ * sVar96 + sVar97;
            auVar115._12_2_ = auVar85._12_2_ * sVar98 + sVar99;
            auVar115._14_2_ = auVar85._14_2_ * sVar100 + sVar101;
            auVar85 = pmulhuw(auVar115,auVar15);
            sVar84 = auVar85._0_2_;
            sVar89 = auVar85._2_2_;
            in_XMM13[1] = (0 < sVar89) * (sVar89 < 0x100) * auVar85[2] - (0xff < sVar89);
            in_XMM13[0] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[0] - (0xff < sVar84);
            sVar84 = auVar85._4_2_;
            in_XMM13[2] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[4] - (0xff < sVar84);
            sVar84 = auVar85._6_2_;
            in_XMM13[3] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[6] - (0xff < sVar84);
            sVar84 = auVar85._8_2_;
            in_XMM13[4] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[8] - (0xff < sVar84);
            sVar84 = auVar85._10_2_;
            in_XMM13[5] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[10] - (0xff < sVar84);
            sVar84 = auVar85._12_2_;
            in_XMM13[6] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[0xc] - (0xff < sVar84);
            sVar84 = auVar85._14_2_;
            in_XMM13[7] = (0 < sVar84) * (sVar84 < 0x100) * auVar85[0xe] - (0xff < sVar84);
            sVar84 = auVar70._0_2_;
            in_XMM13[8] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[0] - (0xff < sVar84);
            sVar84 = auVar70._2_2_;
            in_XMM13[9] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[2] - (0xff < sVar84);
            sVar84 = auVar70._4_2_;
            in_XMM13[10] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[4] - (0xff < sVar84);
            sVar84 = auVar70._6_2_;
            in_XMM13[0xb] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[6] - (0xff < sVar84);
            sVar84 = auVar70._8_2_;
            in_XMM13[0xc] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[8] - (0xff < sVar84);
            sVar84 = auVar70._10_2_;
            in_XMM13[0xd] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[10] - (0xff < sVar84);
            sVar84 = auVar70._12_2_;
            in_XMM13[0xe] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[0xc] - (0xff < sVar84);
            sVar84 = auVar70._14_2_;
            in_XMM13[0xf] = (0 < sVar84) * (sVar84 < 0x100) * auVar70[0xe] - (0xff < sVar84);
            *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = in_XMM13;
            uVar21 = uVar21 + 4;
          }
          for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
            auVar70 = ZEXT416(*(uint *)(lVar33 + uVar21 * 4));
            auVar70 = pmovzxbw(auVar70,auVar70);
            auVar118._0_2_ = auVar70._0_2_ * sVar83 + sVar67 * sVar36 + sVar47;
            auVar118._2_2_ = auVar70._2_2_ * sVar88 + sVar79 * sVar38 + sVar49;
            auVar118._4_2_ = auVar70._4_2_ * sVar90 + sVar67 * sVar39 + sVar50;
            auVar118._6_2_ = auVar70._6_2_ * sVar92 + sVar79 * sVar40 + sVar51;
            auVar118._8_2_ = auVar70._8_2_ * sVar94 + sVar67 * sVar41 + sVar52;
            auVar118._10_2_ = auVar70._10_2_ * sVar96 + sVar79 * sVar42 + sVar53;
            auVar118._12_2_ = auVar70._12_2_ * sVar98 + sVar67 * sVar43 + sVar54;
            auVar118._14_2_ = auVar70._14_2_ * sVar100 + sVar79 * sVar44 + sVar55;
            auVar70 = pmulhuw(auVar118,auVar16);
            sVar84 = auVar70._0_2_;
            sVar89 = auVar70._2_2_;
            sVar91 = auVar70._4_2_;
            sVar93 = auVar70._6_2_;
            *(uint *)(lVar33 + uVar21 * 4) =
                 CONCAT13((0 < sVar93) * (sVar93 < 0x100) * auVar70[6] - (0xff < sVar93),
                          CONCAT12((0 < sVar91) * (sVar91 < 0x100) * auVar70[4] - (0xff < sVar91),
                                   CONCAT11((0 < sVar89) * (sVar89 < 0x100) * auVar70[2] -
                                            (0xff < sVar89),
                                            (0 < sVar84) * (sVar84 < 0x100) * auVar70[0] -
                                            (0xff < sVar84))));
          }
        }
        else {
          puVar24 = (uint32_t *)(lVar33 + uVar21 * 4);
          for (uVar23 = uVar25; 7 < uVar23; uVar23 = uVar23 - 8) {
            *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x10 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x20 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x30 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x40 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x50 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x60 + uVar21 * 4) = auVar35;
            *(undefined1 (*) [16])(lVar33 + 0x70 + uVar21 * 4) = auVar35;
            uVar21 = uVar21 + 0x20;
            puVar24 = puVar24 + 0x20;
          }
          lVar19 = uVar25 - (uVar28 >> 2 & 0x3ffffffffffffff8);
          while (bVar34 = lVar19 != 0, lVar19 = lVar19 + -1, bVar34) {
            *(undefined1 (*) [16])(lVar33 + uVar21 * 4) = auVar35;
            uVar21 = uVar21 + 4;
            puVar24 = puVar24 + 4;
          }
          for (; uVar21 < uVar20; uVar21 = uVar21 + 1) {
            *puVar24 = uVar17;
            puVar24 = puVar24 + 1;
          }
        }
      }
    }
    lVar33 = lVar33 + lVar6;
    lVar32 = lVar32 + *(long *)(this + 0x58) * 8;
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}